

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::PositionalList<int,_args::detail::vector,_args::ValueReader>::~PositionalList
          (PositionalList<int,_args::detail::vector,_args::ValueReader> *this)

{
  ~PositionalList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~PositionalList() {}